

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> * chrono::ImmQ_dt_complete(ChQuaternion<double> *mq,ChVector<double> *qimm_dt)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChQuaternion<double> *mqdt;
  ChQuaternion<double> *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  in_RDI->m_data[2] = 0.0;
  in_RDI->m_data[3] = 0.0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = qimm_dt->m_data[0];
  in_RDI->m_data[1] = qimm_dt->m_data[0];
  dVar1 = qimm_dt->m_data[1];
  in_RDI->m_data[2] = dVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = qimm_dt->m_data[2];
  in_RDI->m_data[3] = qimm_dt->m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = mq->m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1 * mq->m_data[2];
  auVar2 = vfnmsub231sd_fma(auVar5,auVar4,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = mq->m_data[3];
  auVar2 = vfnmadd231sd_fma(auVar2,auVar6,auVar3);
  in_RDI->m_data[0] = auVar2._0_8_ / mq->m_data[0];
  return in_RDI;
}

Assistant:

ChQuaternion<double> ImmQ_dt_complete(const ChQuaternion<double>& mq, const ChVector<double>& qimm_dt) {
    ChQuaternion<double> mqdt;
    mqdt.e1() = qimm_dt.x();
    mqdt.e2() = qimm_dt.y();
    mqdt.e3() = qimm_dt.z();
    mqdt.e0() = (-mq.e1() * mqdt.e1() - mq.e2() * mqdt.e2() - mq.e3() * mqdt.e3()) / mq.e0();
    return mqdt;
}